

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void detectAndDisplay(Mat *frame)

{
  ulong uVar1;
  long lVar2;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> faces;
  vector<cv::Mat,_std::allocator<cv::Mat>_> rgbChannels;
  Mat frame_gray;
  undefined8 *local_198;
  undefined8 *puStack_190;
  undefined8 local_188;
  undefined4 local_178 [2];
  undefined1 *local_170;
  undefined8 local_168;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_160;
  undefined1 *local_148;
  _InputArray *local_140;
  Size SStack_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 local_110;
  Rect local_108;
  _InputArray local_f0 [4];
  Mat local_90 [96];
  
  local_198 = (undefined8 *)0x0;
  puStack_190 = (undefined8 *)0x0;
  local_188 = 0;
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector(&local_160,3,(allocator_type *)local_f0);
  local_f0[0].sz.width = 0;
  local_f0[0].sz.height = 0;
  local_f0[0].flags = 0x1010000;
  SStack_138.width = 0;
  SStack_138.height = 0;
  local_148._0_4_ = 0x2050000;
  local_140 = (_InputArray *)&local_160;
  local_f0[0].obj = frame;
  cv::split(local_f0,(_OutputArray *)&local_148);
  cv::Mat::Mat((Mat *)local_f0,
               local_160.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
               super__Vector_impl_data._M_start + 0xc0);
  SStack_138.width = 0;
  SStack_138.height = 0;
  local_148 = (undefined1 *)CONCAT44(local_148._4_4_,0x1010000);
  local_110 = 0x9600000096;
  local_118 = 0;
  local_140 = local_f0;
  cv::CascadeClassifier::detectMultiScale
            (0x9999999a,face_cascade,&local_148,&local_198,2,6,&local_110,&local_118);
  if (puStack_190 != local_198) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      local_168 = 0;
      local_178[0] = 0x3010000;
      local_170 = debugImage;
      local_128 = *(undefined8 *)((long)local_198 + lVar2);
      uStack_120 = ((undefined8 *)((long)local_198 + lVar2))[1];
      local_148 = &DAT_4093480000000000;
      local_130 = 0;
      local_140 = (_InputArray *)0x0;
      SStack_138.width = 0;
      SStack_138.height = 0;
      cv::rectangle(local_178,&local_128,&local_148,1,8,0);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar1 < (ulong)((long)puStack_190 - (long)local_198 >> 4));
    if (puStack_190 != local_198) {
      cv::Mat::Mat(local_90,(Mat *)local_f0);
      local_108._0_8_ = *local_198;
      local_108._8_8_ = local_198[1];
      findEyes(local_90,&local_108);
      cv::Mat::~Mat(local_90);
    }
  }
  cv::Mat::~Mat((Mat *)local_f0);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_160);
  if (local_198 != (undefined8 *)0x0) {
    operator_delete(local_198);
  }
  return;
}

Assistant:

void detectAndDisplay( cv::Mat frame ) {
  std::vector<cv::Rect> faces;
  //cv::Mat frame_gray;

  std::vector<cv::Mat> rgbChannels(3);
  cv::split(frame, rgbChannels);
  cv::Mat frame_gray = rgbChannels[2];

  //cvtColor( frame, frame_gray, CV_BGR2GRAY );
  //equalizeHist( frame_gray, frame_gray );
  //cv::pow(frame_gray, CV_64F, frame_gray);
  //-- Detect faces
  face_cascade.detectMultiScale( frame_gray, faces, 1.1, 2, 0|cv::CASCADE_SCALE_IMAGE|cv::CASCADE_FIND_BIGGEST_OBJECT, cv::Size(150, 150) );
//  findSkin(debugImage);



  for( int i = 0; i < faces.size(); i++ )
  {
    rectangle(debugImage, faces[i], 1234);
  }
  //-- Show what you got

  if (faces.size() > 0) {
    auto max = faces[0].width;
    int pos = 0;
    for(int i = 1; i < faces.size(); i++){
      if(faces[i].width > max){
        max = faces[i].width;
        pos = i;
      }
    }
    findEyes(frame_gray, faces[0]);
  }
}